

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_im2col(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  void *pvVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  long lVar26;
  long lVar27;
  int64_t iVar28;
  undefined2 uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int64_t iih_1;
  long lVar33;
  void *pvVar34;
  int64_t iih;
  long lVar35;
  long lVar36;
  bool bVar37;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  long local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  void *local_120;
  long local_110;
  void *local_108;
  void *local_e8;
  long local_e0;
  void *local_c8;
  long local_c0;
  long local_b0;
  void *local_a8;
  
  if (dst->type == GGML_TYPE_F32) {
    pgVar7 = dst->src[1];
    if (pgVar7->type == GGML_TYPE_F32) {
      lVar15 = pgVar7->ne[1];
      bVar37 = dst->op_params[6] != 1;
      iVar17 = (int)pgVar7->nb[2];
      iVar28 = dst->src[0]->ne[1];
      lVar13 = pgVar7->ne[2];
      lVar30 = pgVar7->ne[3];
      if (bVar37) {
        lVar13 = lVar15;
        lVar30 = pgVar7->ne[2];
      }
      if (bVar37) {
        lVar15 = 1;
        iVar28 = 1;
      }
      lVar14 = 1;
      if (!bVar37) {
        lVar14 = dst->ne[2];
      }
      iVar11 = (int)pgVar7->nb[3];
      if (bVar37) {
        iVar11 = iVar17;
      }
      if (bVar37) {
        iVar17 = (int)pgVar7->nb[1];
      }
      if (pgVar7->nb[0] == 4) {
        if (0 < lVar30) {
          lVar12 = dst->src[0]->ne[0];
          lVar32 = (long)params->ith;
          iVar1 = dst->op_params[3];
          iVar2 = dst->op_params[2];
          lVar9 = dst->ne[1];
          lVar10 = pgVar7->ne[0];
          iVar3 = dst->op_params[0];
          lVar20 = iVar28 * lVar12;
          local_a8 = (void *)((long)dst->data + lVar20 * lVar32 * 4);
          lVar31 = (long)params->nth;
          iVar4 = dst->op_params[1];
          local_108 = (void *)(lVar32 * iVar17 + lVar10 * iVar1 * -4 + (long)iVar2 * -4);
          iVar5 = dst->op_params[5];
          iVar6 = dst->op_params[4];
          lVar33 = lVar20 * lVar13 * lVar9;
          lVar24 = 0;
          do {
            if (0 < lVar14) {
              local_138 = (void *)0x0;
              local_110 = (long)local_108;
              local_130 = local_a8;
              do {
                if (0 < lVar9) {
                  lVar27 = 0;
                  local_e0 = local_110;
                  local_128 = local_130;
                  lVar35 = -(long)iVar2;
                  do {
                    if (lVar32 < lVar13) {
                      local_120 = local_128;
                      local_c0 = (long)pgVar7->data + local_e0;
                      lVar23 = lVar32;
                      do {
                        if (0 < iVar28) {
                          lVar26 = 0;
                          pvVar18 = local_120;
                          lVar22 = local_c0;
                          do {
                            if (0 < lVar12) {
                              lVar19 = 0;
                              lVar21 = 0;
                              lVar36 = lVar26 * iVar5 +
                                       ((long)local_138 * (long)iVar4 - (long)iVar1);
                              do {
                                uVar38 = 0;
                                if ((((-1 < lVar36) && (lVar36 < lVar15)) && (-1 < lVar35 + lVar19))
                                   && (lVar35 + lVar19 < lVar10)) {
                                  uVar38 = *(undefined4 *)(lVar22 + lVar19 * 4);
                                }
                                *(undefined4 *)((long)pvVar18 + lVar21 * 4) = uVar38;
                                lVar21 = lVar21 + 1;
                                lVar19 = lVar19 + iVar6;
                              } while (lVar12 != lVar21);
                            }
                            lVar26 = lVar26 + 1;
                            pvVar18 = (void *)((long)pvVar18 + lVar12 * 4);
                            lVar22 = lVar22 + lVar10 * iVar5 * 4;
                          } while (lVar26 != iVar28);
                        }
                        local_120 = (void *)((long)local_120 + lVar20 * lVar31 * 4);
                        local_c0 = local_c0 + iVar17 * lVar31;
                        lVar23 = lVar23 + lVar31;
                      } while (lVar23 < lVar13);
                    }
                    lVar35 = lVar35 + iVar3;
                    local_128 = (void *)((long)local_128 + lVar20 * lVar13 * 4);
                    local_e0 = local_e0 + (long)iVar3 * 4;
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != lVar9);
                }
                local_130 = (void *)((long)local_130 + lVar33 * 4);
                local_110 = local_110 + lVar10 * iVar4 * 4;
                local_138 = (void *)((long)local_138 + 1);
              } while (local_138 != (void *)lVar14);
            }
            local_a8 = (void *)((long)local_a8 + lVar33 * lVar14 * 4);
            local_108 = (void *)((long)local_108 + (long)iVar11);
            lVar24 = lVar24 + 1;
          } while (lVar24 != lVar30);
        }
        return;
      }
      pcVar16 = "nb10 == sizeof(float)";
      uVar25 = 0x1671;
    }
    else {
      pcVar16 = "src1->type == GGML_TYPE_F32";
      uVar25 = 0x1653;
    }
  }
  else {
    if (dst->type != GGML_TYPE_F16) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                 ,0x16ef,"fatal error");
    }
    pgVar7 = dst->src[0];
    if (pgVar7->type == GGML_TYPE_F16) {
      pgVar8 = dst->src[1];
      if (pgVar8->type == GGML_TYPE_F32) {
        lVar15 = pgVar8->ne[1];
        bVar37 = dst->op_params[6] != 1;
        lVar30 = pgVar7->ne[1];
        iVar17 = (int)pgVar8->nb[2];
        lVar14 = pgVar8->ne[2];
        lVar13 = pgVar8->ne[3];
        if (bVar37) {
          lVar14 = lVar15;
          lVar13 = pgVar8->ne[2];
        }
        if (bVar37) {
          lVar30 = 1;
          lVar15 = 1;
        }
        lVar12 = 1;
        if (!bVar37) {
          lVar12 = dst->ne[2];
        }
        iVar11 = (int)pgVar8->nb[3];
        if (bVar37) {
          iVar11 = iVar17;
        }
        if (bVar37) {
          iVar17 = (int)pgVar8->nb[1];
        }
        if (pgVar7->nb[0] == 2) {
          if (pgVar8->nb[0] == 4) {
            if (lVar13 < 1) {
              return;
            }
            lVar9 = pgVar7->ne[0];
            lVar31 = (long)params->ith;
            iVar1 = dst->op_params[3];
            iVar2 = dst->op_params[2];
            lVar10 = dst->ne[1];
            iVar3 = dst->op_params[4];
            lVar35 = lVar30 * lVar9;
            lVar20 = pgVar8->ne[0];
            local_108 = (void *)((long)dst->data + lVar35 * lVar31 * 2);
            iVar4 = dst->op_params[1];
            iVar5 = dst->op_params[0];
            local_b0 = lVar31 * iVar17 + lVar20 * iVar1 * -4 + (long)iVar2 * -4;
            iVar6 = dst->op_params[5];
            lVar33 = lVar35 * lVar14 * lVar10;
            lVar32 = (long)params->nth;
            lVar24 = 0;
            do {
              if (0 < lVar12) {
                local_140 = 0;
                local_130 = (void *)local_b0;
                local_138 = local_108;
                do {
                  if (0 < lVar10) {
                    lVar23 = 0;
                    local_128 = local_130;
                    local_e8 = local_138;
                    lVar27 = -(long)iVar2;
                    do {
                      if (lVar31 < lVar14) {
                        local_c8 = local_e8;
                        local_120 = (void *)((long)pgVar8->data + (long)local_128);
                        lVar22 = lVar31;
                        do {
                          if (0 < lVar30) {
                            lVar26 = 0;
                            pvVar18 = local_c8;
                            pvVar34 = local_120;
                            do {
                              if (0 < lVar9) {
                                lVar21 = 0;
                                lVar19 = 0;
                                lVar36 = lVar26 * iVar6 + (local_140 * iVar4 - (long)iVar1);
                                do {
                                  uVar29 = 0;
                                  if (((-1 < lVar36) && (lVar36 < lVar15)) &&
                                     ((-1 < lVar27 + lVar21 &&
                                      (uVar29 = 0, lVar27 + lVar21 < lVar20)))) {
                                    auVar39 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar34 +
                                                                              lVar21 * 4)),0);
                                    uVar29 = auVar39._0_2_;
                                  }
                                  *(undefined2 *)((long)pvVar18 + lVar19 * 2) = uVar29;
                                  lVar19 = lVar19 + 1;
                                  lVar21 = lVar21 + iVar3;
                                } while (lVar9 != lVar19);
                              }
                              lVar26 = lVar26 + 1;
                              pvVar18 = (void *)((long)pvVar18 + lVar9 * 2);
                              pvVar34 = (void *)((long)pvVar34 + lVar20 * iVar6 * 4);
                            } while (lVar26 != lVar30);
                          }
                          local_c8 = (void *)((long)local_c8 + lVar35 * lVar32 * 2);
                          local_120 = (void *)((long)local_120 + iVar17 * lVar32);
                          lVar22 = lVar22 + lVar32;
                        } while (lVar22 < lVar14);
                      }
                      lVar27 = lVar27 + iVar5;
                      local_e8 = (void *)((long)local_e8 + lVar35 * lVar14 * 2);
                      local_128 = (void *)((long)local_128 + (long)iVar5 * 4);
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != lVar10);
                  }
                  local_138 = (void *)((long)local_138 + lVar33 * 2);
                  local_130 = (void *)((long)local_130 + lVar20 * iVar4 * 4);
                  local_140 = local_140 + 1;
                } while (local_140 != lVar12);
              }
              local_108 = (void *)((long)local_108 + lVar33 * lVar12 * 2);
              local_b0 = local_b0 + iVar11;
              lVar24 = lVar24 + 1;
            } while (lVar24 != lVar13);
            return;
          }
          pcVar16 = "nb10 == sizeof(float)";
          uVar25 = 0x16bf;
        }
        else {
          pcVar16 = "nb00 == sizeof(ggml_fp16_t)";
          uVar25 = 0x16be;
        }
      }
      else {
        pcVar16 = "src1->type == GGML_TYPE_F32";
        uVar25 = 0x16a0;
      }
    }
    else {
      pcVar16 = "src0->type == GGML_TYPE_F16";
      uVar25 = 0x169f;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar16);
}

Assistant:

void ggml_compute_forward_im2col(
        const ggml_compute_params * params,
              ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_im2col_f16(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_im2col_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}